

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

void separate_version(char *name,char *ver,int checkp)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  undefined8 uStack_50;
  char ver_buf [16];
  
  pcVar4 = ver_buf;
  uStack_50 = 0x11befe;
  pcVar2 = strchr(name,0x7e);
  pcVar5 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    do {
      lVar6 = 0;
      do {
        lVar1 = lVar6 + 1;
        lVar7 = lVar6 + 1;
        if (pcVar5[lVar1] == '\0') {
          if ((pcVar2 == pcVar5) || (lVar7 != 1 || pcVar2[-1] != '.')) goto LAB_0011bfa7;
          uStack_50 = 0x11bf69;
          strncpy(ver_buf,pcVar2 + 1,(size_t)(pcVar5 + (lVar7 - (long)pcVar2) + -2));
          pcVar5[(long)(ver_buf + (lVar7 - (long)pcVar2) + -2)] = '\0';
          if (checkp == 0) {
            pcVar2[-1] = '\0';
            goto LAB_0011bffe;
          }
          if (ver_buf[0] == '\0') goto LAB_0011bfa7;
          goto LAB_0011bf7f;
        }
        lVar6 = lVar7;
      } while (pcVar5[lVar1] != '~');
      pcVar2 = pcVar5;
      pcVar5 = pcVar5 + lVar7;
    } while( true );
  }
  uStack_50 = 0x11bf9b;
  pcVar4 = strchr(name,0x25);
  if (pcVar4 == (char *)0x0) {
LAB_0011bfa7:
    *ver = '\0';
  }
  else {
    ver[0] = '0';
    ver[1] = '\0';
  }
  return;
LAB_0011bf7f:
  pcVar4 = pcVar4 + 1;
  if (ver_buf[0] == '\0') {
    pcVar2[-1] = '\0';
    pcVar5[lVar6] = '\0';
    uStack_50 = 0x11bfe2;
    uVar3 = strtoul(pcVar2 + 1,(char **)0x0,10);
    uStack_50 = 0x11bff8;
    sprintf(ver_buf,"%u",uVar3 & 0xffffffff);
LAB_0011bffe:
    uStack_50 = 0x11c003;
    strcpy(ver,ver_buf);
    return;
  }
  if ((byte)(ver_buf[0] - 0x3aU) < 0xf6) goto LAB_0011bfa7;
  ver_buf[0] = *pcVar4;
  goto LAB_0011bf7f;
}

Assistant:

void separate_version(char *name, char *ver, int checkp)
{
  char *start, *end, *cp;
  unsigned ver_no;
  size_t len;
  char ver_buf[VERSIONLEN];

  if ((end = (char *)strchr(name, '~')) != (char *)NULL) {
    start = end;
    cp = end + 1;
    while (*cp) {
      if (*cp == '~') {
        start = end;
        end = cp;
      }
      cp++;
    }

    if (start != end && *(start - 1) == '.' && end == (cp - 1)) {
      /*
       * name ends in the form ".~###~". But we have to check
       * ### are all numbers or not, if checkp is 1.
       */
      len = (end - start) - 1;
      strncpy(ver_buf, start + 1, len);
      ver_buf[len] = '\0';
      if (checkp) {
        NumericStringP(ver_buf, YES, NO);
      YES:
        /*
         * name contains a valid version field.
         */
        *(start - 1) = '\0';
        *end = '\0';
        /*
         * Use strtoul() to eliminate leading 0s.
         */
        ver_no = strtoul(start + 1, (char **)NULL, 10);
        sprintf(ver_buf, "%u", ver_no);
        strcpy(ver, ver_buf);
        return;
      } else {
        *(start - 1) = '\0';
        strcpy(ver, ver_buf);
        return;
      }
    }
  } else if (strchr(name, '%')) {
    strcpy(ver, "0");
    return;
  }
NO:
  /* name does not contain a valid version field. */
  *ver = '\0';
}